

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandShowCut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nConeSizeMax;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode;
  char *pcVar2;
  int iVar3;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  nConeSizeMax = 1000000000;
  local_3c = 10;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"NCh"), iVar3 = globalUtilOptind, iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar2 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_001fbb9c:
        Abc_Print(-1,pcVar2);
        goto LAB_001fbba8;
      }
      nConeSizeMax = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if ((int)nConeSizeMax < 0) goto LAB_001fbba8;
    }
    if (iVar1 == -1) {
      if (pNtk == (Abc_Ntk_t *)0x0) {
        pcVar2 = "Empty network.\n";
      }
      else {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (globalUtilOptind + 1 == argc) {
            pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
            if (pNode == (Abc_Obj_t *)0x0) {
              Abc_Print(-1,"Cannot find node \"%s\".\n",argv[globalUtilOptind]);
              return 1;
            }
            Abc_NodeShowCut(pNode,local_3c,nConeSizeMax);
            return 0;
          }
          pcVar2 = "Wrong number of auguments.\n";
          goto LAB_001fbb9c;
        }
        pcVar2 = "Visualizing cuts only works for AIGs (run \"strash\").\n";
      }
      iVar3 = -1;
      goto LAB_001fbc19;
    }
    if (iVar1 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      pcVar2 = "Command line switch \"-N\" should be followed by an integer.\n";
      goto LAB_001fbb9c;
    }
    local_3c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)local_3c);
LAB_001fbba8:
  Abc_Print(-2,"usage: show_cut [-N <num>] [-C <num>] [-h] <node>\n");
  Abc_Print(-2,"             visualizes the cut of a node using DOT and GSVIEW\n");
  Abc_Print(-2,"\t-N <num> : the max size of the cut to be computed [default = %d]\n",
            (ulong)local_3c);
  Abc_Print(-2,"\t-C <num> : the max support of the containing cone [default = %d]\n",
            (ulong)nConeSizeMax);
  Abc_Print(-2,"\t<node>   : the node to consider\n");
  pcVar2 = "\t-h       : print the command usage\n";
  iVar3 = -2;
LAB_001fbc19:
  Abc_Print(iVar3,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandShowCut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c;
    int nNodeSizeMax;
    int nConeSizeMax;
    extern void Abc_NodeShowCut( Abc_Obj_t * pNode, int nNodeSizeMax, int nConeSizeMax );

    // set defaults
    nNodeSizeMax = 10;
    nConeSizeMax = ABC_INFINITY;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConeSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConeSizeMax < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Visualizing cuts only works for AIGs (run \"strash\").\n" );
        return 1;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }

    pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
    if ( pNode == NULL )
    {
        Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
        return 1;
    }
    Abc_NodeShowCut( pNode, nNodeSizeMax, nConeSizeMax );
    return 0;

usage:
    Abc_Print( -2, "usage: show_cut [-N <num>] [-C <num>] [-h] <node>\n" );
    Abc_Print( -2, "             visualizes the cut of a node using DOT and GSVIEW\n" );
#ifdef WIN32
    Abc_Print( -2, "             \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "             (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t-N <num> : the max size of the cut to be computed [default = %d]\n", nNodeSizeMax );
    Abc_Print( -2, "\t-C <num> : the max support of the containing cone [default = %d]\n", nConeSizeMax );
    Abc_Print( -2, "\t<node>   : the node to consider\n");
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}